

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<double>::Subst_Forward(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  double dVar1;
  double **ppdVar2;
  double *pdVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  long local_50;
  undefined4 extraout_var_00;
  
  lVar5 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if ((lVar5 != CONCAT44(extraout_var,iVar4)) ||
     ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = double]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  lVar5 = CONCAT44(extraout_var_00,iVar4);
  if (0 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol) {
    lVar9 = 0;
    local_50 = 0;
    do {
      if (lVar5 < 1) {
        lVar11 = 0;
      }
      else {
        lVar10 = 0;
        do {
          if (((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
             ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_50)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar12 = *(double *)
                    ((long)B->fElem +
                    lVar10 * 8 + (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9);
          lVar11 = lVar10;
        } while (((dVar12 == 0.0) && (!NAN(dVar12))) &&
                (lVar10 = lVar10 + 1, lVar11 = lVar5, lVar5 != lVar10));
      }
      if (lVar11 < lVar5) {
        lVar10 = lVar11 * 8 + -8;
        do {
          ppdVar2 = (this->fElem).fStore;
          pdVar3 = ppdVar2[lVar11 + 1];
          if (((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar11) ||
             ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_50)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          pdVar8 = ppdVar2[lVar11] + 1;
          dVar12 = 0.0;
          if (pdVar8 < pdVar3) {
            pdVar7 = (double *)(lVar9 * lVar6 + lVar10 + (long)B->fElem);
            do {
              dVar12 = dVar12 + *pdVar8 * *pdVar7;
              pdVar8 = pdVar8 + 1;
              pdVar7 = pdVar7 + -1;
            } while (pdVar8 < pdVar3);
          }
          if ((lVar6 <= lVar11) ||
             ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_50)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_50;
          pdVar3 = B->fElem;
          dVar1 = pdVar3[lVar6 + lVar11];
          pdVar3[lVar6 + lVar11] = dVar1 - dVar12;
          pdVar3[lVar6 + lVar11] = (dVar1 - dVar12) / *(this->fElem).fStore[lVar11];
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 8;
        } while (lVar11 != lVar5);
      }
      local_50 = local_50 + 1;
      lVar9 = lVar9 + 8;
    } while (local_50 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}